

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemTxResult
subpage_write(uc_struct_conflict15 *uc,void *opaque,hwaddr addr,uint64_t value,uint len,
             MemTxAttrs attrs)

{
  MemTxResult MVar1;
  undefined1 local_48 [8];
  uint8_t buf [8];
  subpage_t *subpage;
  uint len_local;
  uint64_t value_local;
  hwaddr addr_local;
  void *opaque_local;
  uc_struct_conflict15 *uc_local;
  MemTxAttrs attrs_local;
  
  buf = (uint8_t  [8])opaque;
  stn_le_p(local_48,len,value);
  MVar1 = flatview_write(uc,*(FlatView **)((long)buf + 0xa0),addr + *(long *)((long)buf + 0xa8),
                         attrs,local_48,(ulong)len);
  return MVar1;
}

Assistant:

static MemTxResult subpage_write(struct uc_struct *uc, void *opaque, hwaddr addr,
                                 uint64_t value, unsigned len, MemTxAttrs attrs)
{
    subpage_t *subpage = opaque;
    uint8_t buf[8];

#if defined(DEBUG_SUBPAGE)
    printf("%s: subpage %p len %u addr " TARGET_FMT_plx
           " value %"PRIx64"\n",
           __func__, subpage, len, addr, value);
#endif
    stn_p(buf, len, value);
    return flatview_write(uc, subpage->fv, addr + subpage->base, attrs, buf, len);
}